

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G2.c
# Opt level: O0

int G2_is_on_curve(G2 *op,ATE_CTX *ctx)

{
  int iVar1;
  long in_RSI;
  G2 tmp;
  fp2_t ty;
  fp2_t tx;
  fp2_t b;
  ATE_CTX *in_stack_fffffffffffffe68;
  G2 *in_stack_fffffffffffffe70;
  fp2_struct_st *in_stack_fffffffffffffe78;
  fp2_struct_st *in_stack_fffffffffffffe80;
  ATE_CTX *in_stack_fffffffffffffec0;
  ATE_CTX *in_stack_fffffffffffffec8;
  fp2_struct_st *in_stack_fffffffffffffed0;
  fp2_struct_st *in_stack_fffffffffffffed8;
  fp2_struct_st *in_stack_fffffffffffffee0;
  fp_struct_st local_58 [2];
  long local_10;
  
  local_10 = in_RSI;
  G2_set(in_stack_fffffffffffffe70,(G2 *)in_stack_fffffffffffffe68);
  G2_makeaffine(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  fp2_setzero((fp2_struct_st *)0x127d84);
  fp_set(local_58,(fp_struct_st *)(local_10 + 0x2b0));
  fp2_square(in_stack_fffffffffffffed0,(fp2_struct_st *)in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0);
  fp2_square(in_stack_fffffffffffffed0,(fp2_struct_st *)in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0);
  fp2_mul(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
          in_stack_fffffffffffffec8);
  fp2_add(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70->m_x,
          (fp_struct_st *)in_stack_fffffffffffffe68);
  iVar1 = fp2_cmp((fp2_struct_st *)in_stack_fffffffffffffe68,(fp2_struct_st *)0x127e35);
  return (int)(iVar1 == 0);
}

Assistant:

int G2_is_on_curve(const G2 *op, const ATE_CTX *ctx)
{
    fp2_t b;
    fp2_t tx, ty;
    G2 tmp;
    G2_set(&tmp, op);
    G2_makeaffine(&tmp, ctx);
    fp2_setzero(b);
    fp_set(b->m_a, ctx->b); /* b*sqrt(-2) */

    fp2_square(ty, tmp.m_y, ctx); /* y^2 */
    fp2_square(tx, tmp.m_x, ctx);
    fp2_mul(tx, tx, tmp.m_x, ctx); /* x^3 */
    fp2_add(tx, tx, b, ctx->p); /* x^3 + b*sqrt(-2) */
    
    return fp2_cmp(tx, ty) == 0;
}